

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<float,4ul>>(Attribute *this,array<float,_4UL> *v)

{
  value_type *pvVar1;
  optional<std::array<float,_4UL>_> local_48;
  undefined1 local_34 [8];
  optional<std::array<float,_4UL>_> ret;
  array<float,_4UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<float,_4UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._8_8_ = v;
    primvar::PrimVar::get_value<std::array<float,4ul>>(&local_48,&this->_var);
    nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional<std::array<float,_4UL>,_0>
              ((optional<std::array<float,_4UL>_> *)local_34,&local_48);
    nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional(&local_48);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_34);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                         ((optional<std::array<float,_4UL>_> *)local_34);
      *(undefined8 *)ret.contained._8_8_ = *(undefined8 *)pvVar1->_M_elems;
      *(undefined8 *)(ret.contained._8_8_ + 8) = *(undefined8 *)(pvVar1->_M_elems + 2);
    }
    nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional
              ((optional<std::array<float,_4UL>_> *)local_34);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }